

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

string_view __thiscall RenX::Server::getMapName(Server *this,string_view name)

{
  pointer pMVar1;
  size_t sVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pMVar5;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pMVar5 = (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pMVar5 == pMVar1) {
      sVar4 = 0;
      pcVar3 = (pointer)0x0;
LAB_001332fa:
      sVar6._M_str = pcVar3;
      sVar6._M_len = sVar4;
      return sVar6;
    }
    in_string._M_str = (pMVar5->name)._M_dataplus._M_p;
    in_string._M_len = (pMVar5->name)._M_string_length;
    sVar2 = jessilib::find<char,char,false>(in_string,name);
    if (sVar2 != 0xffffffffffffffff) {
      pcVar3 = (pMVar5->name)._M_dataplus._M_p;
      sVar4 = (pMVar5->name)._M_string_length;
      goto LAB_001332fa;
    }
    pMVar5 = pMVar5 + 1;
  } while( true );
}

Assistant:

bool RenX::Server::isCratesEnabled() const {
	return m_spawnCrates;
}